

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O3

void ON_hsort(void *base,size_t nel,size_t width,_func_int_void_ptr_void_ptr *compar)

{
  void *__dest;
  void *pvVar1;
  uint uVar2;
  int iVar3;
  undefined1 *__dest_00;
  ulong uVar4;
  ulong uVar5;
  void *__src;
  uchar work_memory [64];
  ulong local_a8;
  void *local_a0;
  undefined1 local_78 [72];
  
  if (nel < 2) {
    return;
  }
  local_a8 = nel - 1;
  if (width < 0x41) {
    __dest_00 = local_78;
  }
  else {
    __dest_00 = (undefined1 *)onmalloc(width);
  }
  uVar5 = nel >> 1;
  local_a0 = (void *)(local_a8 * width + (long)base);
  do {
    if (uVar5 == 0) {
      memcpy(__dest_00,local_a0,width);
      memcpy(local_a0,base,width);
      local_a8 = local_a8 - 1;
      if (local_a8 == 0) {
        memcpy(base,__dest_00,width);
        if (width < 0x41) {
          return;
        }
        onfree(__dest_00);
        return;
      }
      local_a0 = (void *)((long)local_a0 - width);
      uVar5 = 0;
    }
    else {
      uVar5 = uVar5 - 1;
      memcpy(__dest_00,(void *)(uVar5 * width + (long)base),width);
    }
    __dest = (void *)(uVar5 * width + (long)base);
    uVar4 = uVar5;
    while (uVar4 * 2 < local_a8) {
      uVar4 = uVar4 * 2 | 1;
      __src = (void *)(uVar4 * width + (long)base);
      if (uVar4 < local_a8) {
        uVar2 = (*compar)(__src,(void *)(width + (long)__src));
        pvVar1 = (void *)(width + (long)__src);
        if (-1 < (int)uVar2) {
          pvVar1 = __src;
        }
        __src = pvVar1;
        uVar4 = uVar4 + (uVar2 >> 0x1f);
      }
      iVar3 = (*compar)(__dest_00,__src);
      if (-1 < iVar3) break;
      memcpy(__dest,__src,width);
      __dest = __src;
    }
    memcpy(__dest,__dest_00,width);
  } while( true );
}

Assistant:

void
ON_hsort(void *base, size_t nel, size_t width, int (*compar)(const void*,const void*))
{
  size_t
    i_end,k;
  unsigned char
    work_memory[work_size], *e_tmp, *e_end;

  if (nel < 2) return;
  k = nel >> 1;
  i_end = nel-1;
  e_end = ((unsigned char*)base) + i_end*width;
  e_tmp = (width > work_size) ? (unsigned char*)onmalloc(width) : work_memory;
  for (;;) {
    if (k) {
      --k;
      memcpy(e_tmp,((unsigned char*)base)+k*width,width); /* e_tmp = e[k]; */
    } 
    else {      
      memcpy(e_tmp,e_end,width);     /* e_tmp = e[i_end]; */
      memcpy(e_end,base,width);      /* e[i_end] = e[0];  */
      if (!(--i_end)) {
        memcpy(base,e_tmp,width);    /* e[0] = e_tmp;     */
        break;
      }
      e_end -= width;
    }
    { size_t i, j;
      unsigned char *e_i, *e_j;
      i = k;
      j = (k<<1) + 1;
      e_i = ((unsigned char*)base) + i*width;
      while (j <= i_end) {
        e_j = ((unsigned char*)base) + j*width;
        if (j < i_end && compar(e_j,e_j+width)<0 /*e[j] < e[j + 1] */)
          {j++; e_j += width;}
        if (compar(e_tmp,e_j)<0 /* e_tmp < e[j] */) {
          memcpy(e_i,e_j,width); /* e[i] = e[j]; */
          i = j;
          e_i = e_j;
          j = (j<<1) + 1;
        } else j = i_end + 1;
      }
      memcpy(e_i,e_tmp,width); /* e[i] = e_tmp; */
    }
  }
  if (width > work_size) onfree(e_tmp); 
}